

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_if_timer(mg_connection *c,double now)

{
  double dVar1;
  double old_value;
  double now_local;
  mg_connection *c_local;
  
  if ((0.0 < c->ev_timer_time) && (c->ev_timer_time <= now)) {
    dVar1 = c->ev_timer_time;
    old_value = now;
    now_local = (double)c;
    mg_call(c,(mg_event_handler_t)0x0,6,&old_value);
    if ((*(double *)((long)now_local + 0x88) == dVar1) &&
       (!NAN(*(double *)((long)now_local + 0x88)) && !NAN(dVar1))) {
      *(undefined8 *)((long)now_local + 0x88) = 0;
    }
  }
  return;
}

Assistant:

void mg_if_timer(struct mg_connection *c, double now) {
    if (c->ev_timer_time > 0 && now >= c->ev_timer_time) {
        double old_value = c->ev_timer_time;
        mg_call(c, NULL, MG_EV_TIMER, &now);
        /*
     * To prevent timer firing all the time, reset the timer after delivery.
     * However, in case user sets it to new value, do not reset.
     */
        if (c->ev_timer_time == old_value) {
            c->ev_timer_time = 0;
        }
    }
}